

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O0

void __thiscall LSM_tree::reset(LSM_tree *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppLVar4;
  long lVar5;
  ostream *this_00;
  path local_78;
  Level *local_50;
  Level *level;
  int i;
  path local_38;
  LSM_tree *local_10;
  LSM_tree *this_local;
  
  local_10 = this;
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_38,(char (*) [5])0x112252,auto_format);
  bVar1 = std::filesystem::exists(&local_38);
  std::filesystem::__cxx11::path::~path(&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    for (level._0_4_ = 0; uVar2 = (ulong)(int)level,
        sVar3 = std::vector<Level_*,_std::allocator<Level_*>_>::size(&this->disk), uVar2 < sVar3;
        level._0_4_ = (int)level + 1) {
      ppLVar4 = std::vector<Level_*,_std::allocator<Level_*>_>::operator[]
                          (&this->disk,(long)(int)level);
      local_50 = *ppLVar4;
      Level::clear(local_50);
    }
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_78,(char (*) [5])0x112252,auto_format);
    lVar5 = std::filesystem::remove_all(&local_78);
    std::filesystem::__cxx11::path::~path(&local_78);
    if (lVar5 == 0) {
      this_00 = std::operator<<((ostream *)&std::cout,"fail to remove DATA");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    std::vector<Level_*,_std::allocator<Level_*>_>::clear(&this->disk);
  }
  return;
}

Assistant:

void LSM_tree::reset() {


    if(!fs::exists("DATA"))
    {
        disk.clear();
        return;
    }

    for (int i = 0; i < disk.size(); i++) {

        //int size=disk[i]->size();
        Level* level=disk[i];
        level->clear();


    }
    if(!std::filesystem::remove_all("DATA"))
    {
        cout<<"fail to remove DATA"<<endl;
    }

}